

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle_private.hh
# Opt level: O0

shared_ptr<QPDFObject> __thiscall
QPDF_Null::create(QPDF_Null *this,shared_ptr<QPDFObject> *parent,string_view *static_descr,
                 string *var_descr)

{
  string *static_descr_00;
  element_type *this_00;
  element_type *this_01;
  QPDF *a_qpdf;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<QPDFObject> sVar1;
  string local_70;
  shared_ptr<QPDFObject> local_50 [2];
  undefined1 local_29;
  string *local_28;
  string *var_descr_local;
  string_view *static_descr_local;
  shared_ptr<QPDFObject> *parent_local;
  shared_ptr<QPDFObject> *n;
  
  local_29 = 0;
  local_28 = var_descr;
  var_descr_local = (string *)static_descr;
  static_descr_local = (string_view *)parent;
  parent_local = (shared_ptr<QPDFObject> *)this;
  QPDFObject::create<QPDF_Null>();
  this_00 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       this);
  this_01 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       parent);
  a_qpdf = QPDFObject::getQPDF(this_01);
  std::shared_ptr<QPDFObject>::shared_ptr(local_50,parent);
  static_descr_00 = var_descr_local;
  std::__cxx11::string::string((string *)&local_70,(string *)var_descr);
  QPDFObject::setChildDescription(this_00,a_qpdf,local_50,(string_view *)static_descr_00,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::shared_ptr<QPDFObject>::~shared_ptr(local_50);
  sVar1.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<QPDFObject>)sVar1.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline std::shared_ptr<QPDFObject>
QPDF_Null::create(
    std::shared_ptr<QPDFObject> parent, std::string_view const& static_descr, std::string var_descr)
{
    auto n = QPDFObject::create<QPDF_Null>();
    n->setChildDescription(parent->getQPDF(), parent, static_descr, var_descr);
    return n;
}